

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SnapshotTextFormatter.cpp
# Opt level: O0

ostream * __thiscall
cali::SnapshotTextFormatter::SnapshotTextFormatterImpl::print
          (SnapshotTextFormatterImpl *this,ostream *os,CaliperMetadataAccessInterface *db,
          vector<cali::Entry,_std::allocator<cali::Entry>_> *list)

{
  bool bVar1;
  int iVar2;
  cali_attr_type cVar3;
  iterator __first;
  iterator __last;
  reference pFVar4;
  ulong uVar5;
  undefined4 extraout_var;
  reference pEVar6;
  cali_id_t cVar7;
  cali_id_t cVar8;
  string *psVar9;
  int *piVar10;
  ostream *poVar11;
  bool bVar12;
  cali_variant_t cVar13;
  char *local_220;
  char *local_200;
  int local_1ec;
  char local_17e;
  lock_guard<std::mutex> local_168;
  lock_guard<std::mutex> g_1;
  int w;
  int len;
  anon_union_8_7_33918203_for_value local_148;
  string local_140;
  cali_variant_t local_120;
  string local_110;
  Node *local_f0;
  Node *node;
  __normal_iterator<const_cali::Entry_*,_std::vector<cali::Entry,_std::allocator<cali::Entry>_>_>
  local_e0;
  const_iterator it;
  Entry e;
  string str;
  cali_attr_type type;
  Field *f;
  iterator __end1;
  iterator __begin1;
  vector<cali::SnapshotTextFormatter::SnapshotTextFormatterImpl::Field,_std::allocator<cali::SnapshotTextFormatter::SnapshotTextFormatterImpl::Field>_>
  *__range1;
  bool update;
  lock_guard<std::mutex> local_48;
  lock_guard<std::mutex> g;
  vector<cali::SnapshotTextFormatter::SnapshotTextFormatterImpl::Field,_std::allocator<cali::SnapshotTextFormatter::SnapshotTextFormatterImpl::Field>_>
  fields;
  vector<cali::Entry,_std::allocator<cali::Entry>_> *list_local;
  CaliperMetadataAccessInterface *db_local;
  ostream *os_local;
  SnapshotTextFormatterImpl *this_local;
  
  std::
  vector<cali::SnapshotTextFormatter::SnapshotTextFormatterImpl::Field,_std::allocator<cali::SnapshotTextFormatter::SnapshotTextFormatterImpl::Field>_>
  ::vector((vector<cali::SnapshotTextFormatter::SnapshotTextFormatterImpl::Field,_std::allocator<cali::SnapshotTextFormatter::SnapshotTextFormatterImpl::Field>_>
            *)&g);
  std::lock_guard<std::mutex>::lock_guard(&local_48,&this->m_field_mutex);
  __first = std::
            vector<cali::SnapshotTextFormatter::SnapshotTextFormatterImpl::Field,_std::allocator<cali::SnapshotTextFormatter::SnapshotTextFormatterImpl::Field>_>
            ::begin(&this->m_fields);
  __last = std::
           vector<cali::SnapshotTextFormatter::SnapshotTextFormatterImpl::Field,_std::allocator<cali::SnapshotTextFormatter::SnapshotTextFormatterImpl::Field>_>
           ::end(&this->m_fields);
  std::
  vector<cali::SnapshotTextFormatter::SnapshotTextFormatterImpl::Field,std::allocator<cali::SnapshotTextFormatter::SnapshotTextFormatterImpl::Field>>
  ::
  assign<__gnu_cxx::__normal_iterator<cali::SnapshotTextFormatter::SnapshotTextFormatterImpl::Field*,std::vector<cali::SnapshotTextFormatter::SnapshotTextFormatterImpl::Field,std::allocator<cali::SnapshotTextFormatter::SnapshotTextFormatterImpl::Field>>>,void>
            ((vector<cali::SnapshotTextFormatter::SnapshotTextFormatterImpl::Field,std::allocator<cali::SnapshotTextFormatter::SnapshotTextFormatterImpl::Field>>
              *)&g,(__normal_iterator<cali::SnapshotTextFormatter::SnapshotTextFormatterImpl::Field_*,_std::vector<cali::SnapshotTextFormatter::SnapshotTextFormatterImpl::Field,_std::allocator<cali::SnapshotTextFormatter::SnapshotTextFormatterImpl::Field>_>_>
                    )__first._M_current,
             (__normal_iterator<cali::SnapshotTextFormatter::SnapshotTextFormatterImpl::Field_*,_std::vector<cali::SnapshotTextFormatter::SnapshotTextFormatterImpl::Field,_std::allocator<cali::SnapshotTextFormatter::SnapshotTextFormatterImpl::Field>_>_>
              )__last._M_current);
  std::lock_guard<std::mutex>::~lock_guard(&local_48);
  bVar12 = false;
  __end1 = std::
           vector<cali::SnapshotTextFormatter::SnapshotTextFormatterImpl::Field,_std::allocator<cali::SnapshotTextFormatter::SnapshotTextFormatterImpl::Field>_>
           ::begin((vector<cali::SnapshotTextFormatter::SnapshotTextFormatterImpl::Field,_std::allocator<cali::SnapshotTextFormatter::SnapshotTextFormatterImpl::Field>_>
                    *)&g);
  f = (Field *)std::
               vector<cali::SnapshotTextFormatter::SnapshotTextFormatterImpl::Field,_std::allocator<cali::SnapshotTextFormatter::SnapshotTextFormatterImpl::Field>_>
               ::end((vector<cali::SnapshotTextFormatter::SnapshotTextFormatterImpl::Field,_std::allocator<cali::SnapshotTextFormatter::SnapshotTextFormatterImpl::Field>_>
                      *)&g);
  do {
    bVar1 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<cali::SnapshotTextFormatter::SnapshotTextFormatterImpl::Field_*,_std::vector<cali::SnapshotTextFormatter::SnapshotTextFormatterImpl::Field,_std::allocator<cali::SnapshotTextFormatter::SnapshotTextFormatterImpl::Field>_>_>
                                *)&f);
    if (!bVar1) {
      if (bVar12) {
        std::lock_guard<std::mutex>::lock_guard(&local_168,&this->m_field_mutex);
        std::
        vector<cali::SnapshotTextFormatter::SnapshotTextFormatterImpl::Field,_std::allocator<cali::SnapshotTextFormatter::SnapshotTextFormatterImpl::Field>_>
        ::swap(&this->m_fields,
               (vector<cali::SnapshotTextFormatter::SnapshotTextFormatterImpl::Field,_std::allocator<cali::SnapshotTextFormatter::SnapshotTextFormatterImpl::Field>_>
                *)&g);
        std::lock_guard<std::mutex>::~lock_guard(&local_168);
      }
      std::
      vector<cali::SnapshotTextFormatter::SnapshotTextFormatterImpl::Field,_std::allocator<cali::SnapshotTextFormatter::SnapshotTextFormatterImpl::Field>_>
      ::~vector((vector<cali::SnapshotTextFormatter::SnapshotTextFormatterImpl::Field,_std::allocator<cali::SnapshotTextFormatter::SnapshotTextFormatterImpl::Field>_>
                 *)&g);
      return os;
    }
    pFVar4 = __gnu_cxx::
             __normal_iterator<cali::SnapshotTextFormatter::SnapshotTextFormatterImpl::Field_*,_std::vector<cali::SnapshotTextFormatter::SnapshotTextFormatterImpl::Field,_std::allocator<cali::SnapshotTextFormatter::SnapshotTextFormatterImpl::Field>_>_>
             ::operator*(&__end1);
    uVar5 = std::__cxx11::string::empty();
    if ((uVar5 & 1) == 0) {
      iVar2 = (*db->_vptr_CaliperMetadataAccessInterface[2])(db,&pFVar4->attr_name);
      (pFVar4->attr).m_node = (Node *)CONCAT44(extraout_var,iVar2);
      std::__cxx11::string::clear();
      cVar3 = Attribute::type(&pFVar4->attr);
      bVar12 = true;
      if (((cVar3 != CALI_TYPE_DOUBLE) && (bVar12 = true, cVar3 != CALI_TYPE_INT)) &&
         (bVar12 = true, cVar3 != CALI_TYPE_UINT)) {
        bVar12 = cVar3 == CALI_TYPE_ADDR;
      }
      local_17e = 'r';
      if (!bVar12) {
        local_17e = 'l';
      }
      pFVar4->align = local_17e;
      bVar12 = true;
    }
    std::__cxx11::string::string((string *)&e.m_value.m_v.value.v_bool);
    bVar1 = Attribute::operator_cast_to_bool(&pFVar4->attr);
    if (bVar1) {
      Entry::Entry((Entry *)&it);
      local_e0._M_current =
           (Entry *)std::vector<cali::Entry,_std::allocator<cali::Entry>_>::begin(list);
      while( true ) {
        node = (Node *)std::vector<cali::Entry,_std::allocator<cali::Entry>_>::end(list);
        bVar1 = __gnu_cxx::operator!=
                          (&local_e0,
                           (__normal_iterator<const_cali::Entry_*,_std::vector<cali::Entry,_std::allocator<cali::Entry>_>_>
                            *)&node);
        if (!bVar1) break;
        pEVar6 = __gnu_cxx::
                 __normal_iterator<const_cali::Entry_*,_std::vector<cali::Entry,_std::allocator<cali::Entry>_>_>
                 ::operator*(&local_e0);
        iVar2 = Entry::count(pEVar6,&pFVar4->attr);
        if (iVar2 != 0) {
          pEVar6 = __gnu_cxx::
                   __normal_iterator<const_cali::Entry_*,_std::vector<cali::Entry,_std::allocator<cali::Entry>_>_>
                   ::operator*(&local_e0);
          it._M_current = (Entry *)pEVar6->m_node;
          e.m_node = (Node *)(pEVar6->m_value).m_v.type_and_size;
          e.m_value.m_v.type_and_size = (pEVar6->m_value).m_v.value.v_uint;
          break;
        }
        __gnu_cxx::
        __normal_iterator<const_cali::Entry_*,_std::vector<cali::Entry,_std::allocator<cali::Entry>_>_>
        ::operator++(&local_e0);
      }
      bVar1 = Entry::is_reference((Entry *)&it);
      if (bVar1) {
        local_f0 = Entry::node((Entry *)&it);
        while (local_f0 != (Node *)0x0) {
          cVar7 = Node::attribute(local_f0);
          cVar8 = Attribute::id(&pFVar4->attr);
          if (cVar7 == cVar8) {
            cVar13 = (cali_variant_t)Node::data(local_f0);
            local_120 = cVar13;
            Variant::to_string_abi_cxx11_(&local_110,(Variant *)&local_120);
            std::__cxx11::string::size();
            psVar9 = (string *)std::__cxx11::string::append((char *)&local_110);
            psVar9 = (string *)std::__cxx11::string::append(psVar9);
            std::__cxx11::string::operator=((string *)&e.m_value.m_v.value.v_bool,psVar9);
            std::__cxx11::string::~string((string *)&local_110);
          }
          local_f0 = util::LockfreeIntrusiveTree<cali::Node>::parent
                               (&local_f0->super_LockfreeIntrusiveTree<cali::Node>);
        }
      }
      else {
        bVar1 = Entry::is_immediate((Entry *)&it);
        if (bVar1) {
          cVar13 = (cali_variant_t)Entry::value((Entry *)&it);
          _w = cVar13;
          Variant::to_string_abi_cxx11_(&local_140,(Variant *)&w);
          std::__cxx11::string::append((string *)&e.m_value.m_v.value.v_bool);
          std::__cxx11::string::~string((string *)&local_140);
        }
      }
    }
    iVar2 = std::__cxx11::string::size();
    if (iVar2 < pFVar4->width) {
      g_1._M_device._4_4_ = pFVar4->width - iVar2;
      g_1._M_device._0_4_ = 0x50;
      piVar10 = std::min<int>((int *)((long)&g_1._M_device + 4),(int *)&g_1);
      local_1ec = *piVar10;
    }
    else {
      local_1ec = 0;
    }
    if (pFVar4->align == 'r') {
      poVar11 = std::operator<<(os,(string *)pFVar4);
      if (local_1ec < 1) {
        local_200 = "";
      }
      else {
        local_200 = "                                                                                "
                    + (0x50 - local_1ec);
      }
      poVar11 = std::operator<<(poVar11,local_200);
      std::operator<<(poVar11,(string *)&e.m_value.m_v.value.v_bool);
    }
    else {
      poVar11 = std::operator<<(os,(string *)pFVar4);
      poVar11 = std::operator<<(poVar11,(string *)&e.m_value.m_v.value.v_bool);
      if (local_1ec < 1) {
        local_220 = "";
      }
      else {
        local_220 = "                                                                                "
                    + (0x50 - local_1ec);
      }
      std::operator<<(poVar11,local_220);
    }
    std::__cxx11::string::~string((string *)&e.m_value.m_v.value.v_bool);
    __gnu_cxx::
    __normal_iterator<cali::SnapshotTextFormatter::SnapshotTextFormatterImpl::Field_*,_std::vector<cali::SnapshotTextFormatter::SnapshotTextFormatterImpl::Field,_std::allocator<cali::SnapshotTextFormatter::SnapshotTextFormatterImpl::Field>_>_>
    ::operator++(&__end1);
  } while( true );
}

Assistant:

std::ostream& print(std::ostream& os, const CaliperMetadataAccessInterface& db, const std::vector<Entry>& list)
    {
        std::vector<Field> fields;

        {
            std::lock_guard<std::mutex> g(m_field_mutex);

            fields.assign(m_fields.begin(), m_fields.end());
        }

        bool update = false;

        for (Field& f : fields) {
            if (!f.attr_name.empty()) {
                f.attr = db.get_attribute(f.attr_name);
                f.attr_name.clear();

                cali_attr_type type = f.attr.type();

                f.align = (type == CALI_TYPE_DOUBLE || type == CALI_TYPE_INT || type == CALI_TYPE_UINT
                           || type == CALI_TYPE_ADDR)
                              ? 'r'
                              : 'l';

                update = true;
            }

            std::string str;

            if (f.attr) {
                Entry e;

                for (auto it = list.begin(); it != list.end(); ++it)
                    if ((*it).count(f.attr)) {
                        e = *it;
                        break;
                    }

                if (e.is_reference()) {
                    for (const Node* node = e.node(); node; node = node->parent())
                        if (node->attribute() == f.attr.id())
                            str = node->data().to_string().append(str.size() ? "/" : "").append(str);
                } else if (e.is_immediate()) {
                    str.append(e.value().to_string());
                }
            }

            static const char whitespace[80 + 1] =
                "                                        "
                "                                        ";

            int len = str.size();
            int w   = len < f.width ? std::min<int>(f.width - len, 80) : 0;

            if (f.align == 'r')
                os << f.prefix << (w > 0 ? whitespace + (80 - w) : "") << str;
            else
                os << f.prefix << str << (w > 0 ? whitespace + (80 - w) : "");
        }

        if (update) {
            std::lock_guard<std::mutex> g(m_field_mutex);

            m_fields.swap(fields);
        }

        return os;
    }